

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::javanano::AccessorEnumFieldGenerator::~AccessorEnumFieldGenerator
          (AccessorEnumFieldGenerator *this)

{
  ~AccessorEnumFieldGenerator(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

void AccessorEnumFieldGenerator::
GenerateMembers(io::Printer* printer, bool /* unused lazy_init */) const {
  printer->Print(variables_, "private int $name$_;\n");
  if (params_.generate_intdefs()) {
    printer->Print(variables_, "$message_type_intdef$\n");
  }
  printer->Print(variables_,
    "public int get$capitalized_name$() {\n"
    "  return $name$_;\n"
    "}\n"
    "public $message_name$ set$capitalized_name$(");
  if (params_.generate_intdefs()) {
    printer->Print(variables_,
      "\n"
      "    $message_type_intdef$ ");
  }
  printer->Print(variables_,
    "int value) {\n"
    "  $name$_ = value;\n"
    "  $set_has$;\n"
    "  return this;\n"
    "}\n"
    "public boolean has$capitalized_name$() {\n"
    "  return $get_has$;\n"
    "}\n"
    "public $message_name$ clear$capitalized_name$() {\n"
    "  $name$_ = $default$;\n"
    "  $clear_has$;\n"
    "  return this;\n"
    "}\n");
}